

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O0

AggregateFunction *
duckdb::
GetHistogramFunction<duckdb::HistogramFunctor,long,duckdb::DefaultMapType<std::map<long,unsigned_long,std::less<long>,std::allocator<std::pair<long_const,unsigned_long>>>>>
          (LogicalType *type)

{
  initializer_list<duckdb::LogicalType> iVar1;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  LogicalType struct_type;
  allocator_type *in_stack_fffffffffffffe68;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffe70;
  iterator in_stack_fffffffffffffe78;
  size_type in_stack_fffffffffffffe80;
  LogicalType *local_110;
  aggregate_size_t state_size;
  allocator *return_type;
  AggregateFunction *name;
  AggregateFunction *in_stack_ffffffffffffff20;
  aggregate_update_t in_stack_ffffffffffffff30;
  aggregate_combine_t in_stack_ffffffffffffff38;
  aggregate_finalize_t in_stack_ffffffffffffff40;
  aggregate_simple_update_t simple_update;
  bind_aggregate_function_t bind;
  aggregate_destructor_t in_stack_ffffffffffffff58;
  aggregate_statistics_t in_stack_ffffffffffffff60;
  aggregate_window_t in_stack_ffffffffffffff68;
  aggregate_serialize_t in_stack_ffffffffffffff70;
  aggregate_deserialize_t in_stack_ffffffffffffff78;
  LogicalType local_58 [24];
  LogicalType local_40 [24];
  LogicalType local_28 [24];
  LogicalType *local_10;
  
  name = in_RDI;
  local_10 = in_RSI;
  duckdb::LogicalType::LogicalType(local_40,in_RSI);
  duckdb::LogicalType::LogicalType(local_58,UBIGINT);
  duckdb::LogicalType::MAP(local_28,local_40,local_58);
  duckdb::LogicalType::~LogicalType(local_58);
  duckdb::LogicalType::~LogicalType(local_40);
  return_type = (allocator *)&stack0xffffffffffffff77;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff78,"histogram",return_type);
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff30,local_10);
  simple_update = (aggregate_simple_update_t)&stack0xffffffffffffff30;
  bind = (bind_aggregate_function_t)0x1;
  state_size = (aggregate_size_t)&stack0xffffffffffffff27;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xb583cf);
  iVar1._M_len = in_stack_fffffffffffffe80;
  iVar1._M_array = in_stack_fffffffffffffe78;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffe70,iVar1,in_stack_fffffffffffffe68);
  AggregateFunction::AggregateFunction
            (in_stack_ffffffffffffff20,(string *)name,(vector<duckdb::LogicalType,_true> *)in_RDI,
             (LogicalType *)return_type,state_size,(aggregate_initialize_t)&stack0xfffffffffffffe68,
             in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,in_stack_ffffffffffffff40,
             simple_update,bind,in_stack_ffffffffffffff58,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xb5849e);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xb584ab);
  local_110 = (LogicalType *)&stack0xffffffffffffff48;
  do {
    local_110 = local_110 + -0x18;
    duckdb::LogicalType::~LogicalType(local_110);
  } while (local_110 != (LogicalType *)&stack0xffffffffffffff30);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  duckdb::LogicalType::~LogicalType(local_28);
  return name;
}

Assistant:

static AggregateFunction GetHistogramFunction(const LogicalType &type) {
	using STATE_TYPE = HistogramAggState<T, typename MAP_TYPE::MAP_TYPE>;
	using HIST_FUNC = HistogramFunction<MAP_TYPE>;

	auto struct_type = LogicalType::MAP(type, LogicalType::UBIGINT);
	return AggregateFunction(
	    "histogram", {type}, struct_type, AggregateFunction::StateSize<STATE_TYPE>,
	    AggregateFunction::StateInitialize<STATE_TYPE, HIST_FUNC>, HistogramUpdateFunction<OP, T, MAP_TYPE>,
	    AggregateFunction::StateCombine<STATE_TYPE, HIST_FUNC>, HistogramFinalizeFunction<OP, T, MAP_TYPE>, nullptr,
	    nullptr, AggregateFunction::StateDestroy<STATE_TYPE, HIST_FUNC>);
}